

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void constructor(LexState *ls,expdesc *t)

{
  FuncState *fs;
  uint uVar1;
  int iVar2;
  int iVar3;
  ConsControl cc;
  ConsControl local_80;
  
  fs = ls->fs;
  iVar3 = ls->linenumber;
  uVar1 = luaK_codeABC(fs,OP_NEWTABLE,0,0,0);
  local_80.tostore = 0;
  local_80.nh = 0;
  local_80.na = 0;
  t->t = -1;
  t->f = -1;
  t->k = VRELOCABLE;
  (t->u).info = uVar1;
  t->ravi_type_map = 0x80;
  t->usertype = (TString *)0x0;
  (t->u).ind.usertype = (TString *)0x0;
  t->pc = uVar1;
  local_80.v.t = -1;
  local_80.v.f = -1;
  local_80.v.k = VVOID;
  local_80.v.u.info = 0;
  local_80.v.ravi_type_map = 0xffffffff;
  local_80.v.usertype = (TString *)0x0;
  local_80.v.pc = -1;
  local_80.v.u.ind.usertype = (TString *)0x0;
  local_80.t = t;
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  while( true ) {
    if ((local_80.v.k != VVOID) && (local_80.tostore < 1)) {
      __assert_fail("cc.v.k == VVOID || cc.tostore > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lparser.c"
                    ,0x4b3,"void constructor(LexState *, expdesc *)");
    }
    if ((ls->t).token == 0x7d) break;
    if (local_80.v.k != VVOID) {
      luaK_exp2nextreg(fs,&local_80.v);
      local_80.v.k = VVOID;
      if (local_80.tostore == 0x32) {
        luaK_setlist(fs,((local_80.t)->u).info,local_80.na,0x32);
        local_80.tostore = 0;
      }
    }
    iVar2 = (ls->t).token;
    if (iVar2 == 0x5b) {
LAB_0011e773:
      recfield(ls,&local_80);
    }
    else {
      if (iVar2 == 0x125) {
        iVar2 = luaX_lookahead(ls);
        if (iVar2 == 0x3d) goto LAB_0011e773;
      }
      subexpr(ls,&local_80.v,0);
      local_80.na = local_80.na + 1;
      local_80.tostore = local_80.tostore + 1;
    }
    if (((ls->t).token != 0x2c) && ((ls->t).token != 0x3b)) break;
    luaX_next(ls);
  }
  check_match(ls,0x7d,0x7b,iVar3);
  if (local_80.tostore != 0) {
    if (local_80.v.k - VCALL < 2) {
      luaK_setreturns(fs,&local_80.v,-1);
      luaK_setlist(fs,((local_80.t)->u).info,local_80.na,-1);
      local_80.na = local_80.na - 1;
    }
    else {
      if (local_80.v.k != VVOID) {
        luaK_exp2nextreg(fs,&local_80.v);
      }
      luaK_setlist(fs,((local_80.t)->u).info,local_80.na,local_80.tostore);
    }
  }
  iVar3 = luaO_int2fb(local_80.na);
  *(char *)((long)fs->f->code + (long)(int)uVar1 * 4 + 3) = (char)iVar3;
  iVar3 = luaO_int2fb(local_80.nh);
  *(char *)((long)fs->f->code + (long)(int)uVar1 * 4 + 2) = (char)iVar3;
  if (((byte)ravi_parser_debug & 1) != 0) {
    raviY_printf(ls->fs,"constructor (OP_NEWTABLE pc = %d) %e\n",(ulong)uVar1,t);
  }
  return;
}

Assistant:

static void constructor (LexState *ls, expdesc *t) {
  /* constructor -> '{' [ field { sep field } [sep] ] '}'
     sep -> ',' | ';' */
  FuncState *fs = ls->fs;
  int line = ls->linenumber;
  int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
  struct ConsControl cc;
  cc.na = cc.nh = cc.tostore = 0;
  cc.t = t;
  init_exp(t, VRELOCABLE, pc, RAVI_TM_TABLE, NULL); /* RAVI initial type may be modified */
  t->pc = pc; /* RAVI save pc of OP_NEWTABLE instruction so that the correct type can be set later */
  init_exp(&cc.v, VVOID, 0, RAVI_TM_ANY, NULL);  /* no value (yet) */
  luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top */
  checknext(ls, '{');
  do {
    lua_assert(cc.v.k == VVOID || cc.tostore > 0);
    if (ls->t.token == '}') break;
    closelistfield(fs, &cc);
    field(ls, &cc);
  } while (testnext(ls, ',') || testnext(ls, ';'));
  check_match(ls, '}', '{', line);
  lastlistfield(fs, &cc);
  SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
  SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
  DEBUG_EXPR(raviY_printf(ls->fs, "constructor (OP_NEWTABLE pc = %d) %e\n", pc, t);)
}